

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncGenerator.h
# Opt level: O1

AsyncGeneratorRequest * __thiscall
Js::JavascriptAsyncGenerator::PeekRequest(JavascriptAsyncGenerator *this)

{
  DList<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_Memory::Recycler,_RealCount> *pDVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  AsyncGeneratorRequest **ppAVar5;
  
  pDVar1 = (this->requestQueue).ptr;
  if ((DList<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_Memory::Recycler,_RealCount> *)
      (pDVar1->super_DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount>).
      super_DListNodeBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*>.next.base == pDVar1
     ) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptAsyncGenerator.h"
                                ,0x49,"(!requestQueue->Empty())","!requestQueue->Empty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  ppAVar5 = DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount>::Head
                      (&((this->requestQueue).ptr)->
                        super_DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount>
                      );
  return *ppAVar5;
}

Assistant:

AsyncGeneratorRequest* PeekRequest()
    {
        Assert(!requestQueue->Empty());
        return requestQueue->Head();
    }